

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O1

void __thiscall
helics::apps::WebServer::mainLoop(WebServer *this,shared_ptr<helics::apps::WebServer> *keepAlive)

{
  string *psVar1;
  error_code *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  json *pjVar3;
  io_context *piVar4;
  int iVar5;
  const_iterator cVar6;
  const_reference pvVar7;
  iterator iVar8;
  const_reference pvVar9;
  undefined1 uVar10;
  InterfaceNetworks IVar11;
  undefined1 uVar12;
  address address;
  int ret_5;
  int ret;
  error_code *local_100 [2];
  error_code local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  bool local_ba;
  undefined1 local_b9;
  undefined1 local_b8 [32];
  data_union local_98;
  const_reference local_78;
  uchar auStack_70 [8];
  Listener *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined1 local_50 [32];
  
  if (this->mHttpEnabled == true) {
    IVar11 = (InterfaceNetworks)this->mInterfaceNetwork;
    pjVar3 = this->config;
    if ((pjVar3->m_data).m_type == object) {
      cVar6 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[5],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          *)(pjVar3->m_data).m_value.object,(char (*) [5])0x42efaa);
      if ((_Rb_tree_header *)cVar6._M_node !=
          &(((pjVar3->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)this->config,"http");
        peVar2 = &((system_error *)local_100)->m_error_code;
        local_100[0] = peVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"interface","");
        if ((pvVar7->m_data).m_type == object) {
          iVar8 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(&((pvVar7->m_data).m_value.object)->_M_t,(key_type *)local_100);
          if ((_Rb_tree_header *)iVar8._M_node !=
              &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
            pvVar9 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pvVar7,(key_type *)local_100);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_50,pvVar9);
            mainLoop();
          }
        }
        if (local_100[0] != peVar2) {
          operator_delete(local_100[0],local_f0._0_8_ + 1);
        }
        local_100[0] = peVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"port","");
        if ((pvVar7->m_data).m_type == object) {
          iVar8 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(&((pvVar7->m_data).m_value.object)->_M_t,(key_type *)local_100);
          if ((_Rb_tree_header *)iVar8._M_node !=
              &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
            pvVar9 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pvVar7,(key_type *)local_100);
            local_98._0_4_ = 0;
            nlohmann::json_abi_v3_11_3::detail::
            from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_int,_0>
                      (pvVar9,(int *)&local_98);
            this->mHttpPort = local_98._0_4_;
          }
        }
        if (local_100[0] != peVar2) {
          operator_delete(local_100[0],local_f0._0_8_ + 1);
        }
        local_100[0] = peVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"ipv4","");
        if ((pvVar7->m_data).m_type == object) {
          iVar8 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(&((pvVar7->m_data).m_value.object)->_M_t,(key_type *)local_100);
          if ((_Rb_tree_header *)iVar8._M_node ==
              &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)
          goto LAB_001c765b;
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pvVar7,(key_type *)local_100);
          local_98._0_4_ = local_98._0_4_ & 0xffffff00;
          nlohmann::json_abi_v3_11_3::detail::
          from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    (pvVar9,(boolean_t *)&local_98);
          uVar12 = local_98.base.sa_family._0_1_;
        }
        else {
LAB_001c765b:
          uVar12 = '\0';
        }
        if (local_100[0] != peVar2) {
          operator_delete(local_100[0],local_f0._0_8_ + 1);
        }
        if (uVar12 != '\0') {
          IVar11 = IPV4;
        }
        local_100[0] = peVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"ipv6","");
        local_78 = pvVar7;
        if ((pvVar7->m_data).m_type == object) {
          iVar8 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(&((pvVar7->m_data).m_value.object)->_M_t,(key_type *)local_100);
          if ((_Rb_tree_header *)iVar8._M_node ==
              &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)
          goto LAB_001c7883;
          pvVar7 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pvVar7,(key_type *)local_100);
          local_98._0_4_ = local_98._0_4_ & 0xffffff00;
          nlohmann::json_abi_v3_11_3::detail::
          from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    (pvVar7,(boolean_t *)&local_98);
          uVar10 = local_98.base.sa_family._0_1_;
        }
        else {
LAB_001c7883:
          uVar10 = '\0';
        }
        if (local_100[0] != peVar2) {
          operator_delete(local_100[0],local_f0._0_8_ + 1);
        }
        if (uVar10 != '\0') {
          IVar11 = uVar12 * '\x04' + IPV6;
        }
        local_100[0] = peVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"external","");
        pvVar7 = local_78;
        if ((local_78->m_data).m_type == object) {
          iVar8 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(&((local_78->m_data).m_value.object)->_M_t,(key_type *)local_100);
          if ((_Rb_tree_header *)iVar8._M_node ==
              &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)
          goto LAB_001c79bb;
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pvVar7,(key_type *)local_100);
          local_98._0_4_ = local_98._0_4_ & 0xffffff00;
          nlohmann::json_abi_v3_11_3::detail::
          from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    (pvVar9,(boolean_t *)&local_98);
          uVar12 = local_98.base.sa_family._0_1_;
        }
        else {
LAB_001c79bb:
          uVar12 = '\0';
        }
        if (local_100[0] != peVar2) {
          operator_delete(local_100[0],local_f0._0_8_ + 1);
        }
        local_100[0] = peVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"all","");
        if ((pvVar7->m_data).m_type == object) {
          iVar8 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(&((pvVar7->m_data).m_value.object)->_M_t,(key_type *)local_100);
          if ((_Rb_tree_header *)iVar8._M_node !=
              &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
            pvVar7 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pvVar7,(key_type *)local_100);
            local_98._0_4_ = local_98._0_4_ & 0xffffff00;
            nlohmann::json_abi_v3_11_3::detail::
            from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                      (pvVar7,(boolean_t *)&local_98);
            uVar12 = local_98.base.sa_family._0_1_;
          }
        }
        if (local_100[0] != peVar2) {
          operator_delete(local_100[0],local_f0._0_8_ + 1);
        }
        if (uVar12 != '\0') {
          IVar11 = ALL;
        }
      }
    }
    psVar1 = &this->mHttpAddress;
    gmlc::networking::generateMatchingInterfaceAddress((string *)local_100,(string *)psVar1,IVar11);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100
              );
    if (local_100[0] != &((system_error *)local_100)->m_error_code) {
      operator_delete(local_100[0],local_f0._0_8_ + 1);
    }
    gmlc::networking::removeProtocol((string *)psVar1);
    iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(psVar1,"*");
    if (iVar5 == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace(psVar1,0,(this->mHttpAddress)._M_string_length,"0.0.0.0",7);
    }
    boost::asio::ip::make_address((address *)local_100,(this->mHttpAddress)._M_dataplus._M_p);
    piVar4 = &((this->context).
               super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ioc
    ;
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::tcp> *)&local_98.base,(address *)local_100,
               (unsigned_short)this->mHttpPort);
    std::__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<Listener>,boost::asio::io_context&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
              ((__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2> *)local_b8,
               (allocator<Listener> *)&local_60,piVar4,
               (basic_endpoint<boost::asio::ip::tcp> *)&local_98.base);
    Listener::do_accept((Listener *)CONCAT44(local_b8._4_4_,local_b8._0_4_));
    if ((uchar  [8])local_b8._8_8_ != (uchar  [8])0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
  }
  if (this->mWebsocketEnabled != true) goto LAB_001c7452;
  IVar11 = (InterfaceNetworks)this->mInterfaceNetwork;
  pjVar3 = this->config;
  if ((pjVar3->m_data).m_type == object) {
    cVar6 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
            ::_M_find_tr<char[10],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        *)(pjVar3->m_data).m_value.object,(char (*) [10])0x429b49);
    if ((_Rb_tree_header *)cVar6._M_node !=
        &(((pjVar3->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar7 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)this->config,"websocket");
      peVar2 = &((system_error *)local_100)->m_error_code;
      local_100[0] = peVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"interface","");
      if ((pvVar7->m_data).m_type == object) {
        iVar8 = CLI::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                ::find(&((pvVar7->m_data).m_value.object)->_M_t,(key_type *)local_100);
        if ((_Rb_tree_header *)iVar8._M_node !=
            &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pvVar7,(key_type *)local_100);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_98,pvVar9);
          mainLoop();
        }
      }
      if (local_100[0] != peVar2) {
        operator_delete(local_100[0],local_f0._0_8_ + 1);
      }
      local_100[0] = peVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"port","");
      if ((pvVar7->m_data).m_type == object) {
        iVar8 = CLI::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                ::find(&((pvVar7->m_data).m_value.object)->_M_t,(key_type *)local_100);
        if ((_Rb_tree_header *)iVar8._M_node !=
            &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pvVar7,(key_type *)local_100);
          local_b8._0_4_ = 0;
          nlohmann::json_abi_v3_11_3::detail::
          from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_int,_0>
                    (pvVar9,(int *)local_b8);
          this->mWebsocketPort = local_b8._0_4_;
        }
      }
      if (local_100[0] != peVar2) {
        operator_delete(local_100[0],local_f0._0_8_ + 1);
      }
      local_100[0] = peVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"ipv4","");
      if ((pvVar7->m_data).m_type == object) {
        iVar8 = CLI::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                ::find(&((pvVar7->m_data).m_value.object)->_M_t,(key_type *)local_100);
        if ((_Rb_tree_header *)iVar8._M_node ==
            &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)
        goto LAB_001c77ef;
        pvVar9 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[](pvVar7,(key_type *)local_100);
        local_b8._0_4_ = local_b8._0_4_ & 0xffffff00;
        nlohmann::json_abi_v3_11_3::detail::
        from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  (pvVar9,(boolean_t *)local_b8);
        uVar12 = local_b8[0];
      }
      else {
LAB_001c77ef:
        uVar12 = (__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>)0x0;
      }
      if (local_100[0] != peVar2) {
        operator_delete(local_100[0],local_f0._0_8_ + 1);
      }
      if ((__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>)uVar12 !=
          (__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>)0x0) {
        IVar11 = IPV4;
      }
      local_100[0] = peVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"ipv6","");
      local_78 = pvVar7;
      if ((pvVar7->m_data).m_type == object) {
        iVar8 = CLI::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                ::find(&((pvVar7->m_data).m_value.object)->_M_t,(key_type *)local_100);
        if ((_Rb_tree_header *)iVar8._M_node ==
            &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)
        goto LAB_001c7919;
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[](pvVar7,(key_type *)local_100);
        local_b8._0_4_ = local_b8._0_4_ & 0xffffff00;
        nlohmann::json_abi_v3_11_3::detail::
        from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  (pvVar7,(boolean_t *)local_b8);
        uVar10 = local_b8[0];
      }
      else {
LAB_001c7919:
        uVar10 = (__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>)0x0;
      }
      if (local_100[0] != peVar2) {
        operator_delete(local_100[0],local_f0._0_8_ + 1);
      }
      if ((__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>)uVar10 !=
          (__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>)0x0) {
        IVar11 = uVar12 * '\x04' + IPV6;
      }
      local_100[0] = peVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"external","");
      pvVar7 = local_78;
      if ((local_78->m_data).m_type == object) {
        iVar8 = CLI::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                ::find(&((local_78->m_data).m_value.object)->_M_t,(key_type *)local_100);
        if ((_Rb_tree_header *)iVar8._M_node ==
            &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)
        goto LAB_001c7a5b;
        pvVar9 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[](pvVar7,(key_type *)local_100);
        local_b8._0_4_ = local_b8._0_4_ & 0xffffff00;
        nlohmann::json_abi_v3_11_3::detail::
        from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  (pvVar9,(boolean_t *)local_b8);
        uVar12 = local_b8[0];
      }
      else {
LAB_001c7a5b:
        uVar12 = (__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>)0x0;
      }
      if (local_100[0] != peVar2) {
        operator_delete(local_100[0],local_f0._0_8_ + 1);
      }
      local_100[0] = peVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"all","");
      if ((pvVar7->m_data).m_type == object) {
        iVar8 = CLI::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                ::find(&((pvVar7->m_data).m_value.object)->_M_t,(key_type *)local_100);
        if ((_Rb_tree_header *)iVar8._M_node !=
            &(((pvVar7->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
          pvVar7 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pvVar7,(key_type *)local_100);
          local_b8._0_4_ = local_b8._0_4_ & 0xffffff00;
          nlohmann::json_abi_v3_11_3::detail::
          from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    (pvVar7,(boolean_t *)local_b8);
          uVar12 = local_b8[0];
        }
      }
      if (local_100[0] != peVar2) {
        operator_delete(local_100[0],local_f0._0_8_ + 1);
      }
      if ((__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>)uVar12 !=
          (__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>)0x0) {
        IVar11 = ALL;
      }
    }
  }
  psVar1 = &this->mWebsocketAddress;
  gmlc::networking::generateMatchingInterfaceAddress((string *)local_100,(string *)psVar1,IVar11);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  if (local_100[0] != &((system_error *)local_100)->m_error_code) {
    operator_delete(local_100[0],local_f0._0_8_ + 1);
  }
  gmlc::networking::removeProtocol((string *)psVar1);
  iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare(psVar1,"*");
  if (iVar5 == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (psVar1,0,(this->mWebsocketAddress)._M_string_length,"0.0.0.0",7);
  }
  boost::asio::ip::make_address((address *)local_100,(this->mWebsocketAddress)._M_dataplus._M_p);
  piVar4 = &((this->context).
             super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ioc;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)local_b8,(address *)local_100,
             (unsigned_short)this->mWebsocketPort);
  local_ba = true;
  std::__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<Listener>,boost::asio::io_context&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,bool>
            ((__shared_ptr<Listener,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (allocator<Listener> *)&local_b9,piVar4,
             (basic_endpoint<boost::asio::ip::tcp> *)local_b8,&local_ba);
  Listener::do_accept(local_60);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
LAB_001c7452:
  LOCK();
  (this->executing)._M_base._M_i = true;
  UNLOCK();
  if (((this->running)._M_base._M_i & 1U) != 0) {
    local_b8._0_4_ = 0;
    local_b8._4_4_ = local_b8._4_4_ & 0xffffff00;
    local_b8._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
    boost::asio::detail::scheduler::run
              ((((this->context).
                 super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               ioc).impl_,(error_code *)local_b8);
    if ((bool)local_b8[4] == true) {
      local_78._4_4_ = local_b8._4_4_;
      local_78._0_4_ = local_b8._0_4_;
      auStack_70[0] = local_b8[8];
      auStack_70[1] = local_b8[9];
      auStack_70[2] = local_b8[10];
      auStack_70[3] = local_b8[0xb];
      auStack_70[4] = local_b8[0xc];
      auStack_70[5] = local_b8[0xd];
      auStack_70[6] = local_b8[0xe];
      auStack_70[7] = local_b8[0xf];
      std::runtime_error::runtime_error((runtime_error *)local_100,"");
      local_100[0] = (error_code *)&PTR__system_error_0055a9e0;
      local_f0._0_8_ = local_78;
      local_f0.cat_ = (error_category *)auStack_70;
      local_e0._M_p = (pointer)((long)&((system_error *)local_100)->m_what + 0x10);
      local_d8 = 0;
      local_d0._M_local_buf[0] = '\0';
      boost::throw_exception<boost::system::system_error>((system_error *)local_100);
    }
  }
  LOCK();
  (this->executing)._M_base._M_i = false;
  UNLOCK();
  this_00 = (keepAlive->super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (keepAlive->super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (keepAlive->super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void WebServer::mainLoop(std::shared_ptr<WebServer> keepAlive)
{
    if (mHttpEnabled) {
        auto httpInterfaceNetwork = mInterfaceNetwork;
        if (config->contains("http")) {
            const auto& httpConfig = (*config)["http"];
            helics::fileops::replaceIfMember(httpConfig, "interface", mHttpAddress);
            helics::fileops::replaceIfMember(httpConfig, "port", mHttpPort);
            const bool ipv4 = helics::fileops::getOrDefault(httpConfig, "ipv4", false);

            if (ipv4) {
                httpInterfaceNetwork = static_cast<int>(gmlc::networking::InterfaceNetworks::IPV4);
            }
            const bool ipv6 = helics::fileops::getOrDefault(httpConfig, "ipv6", false);
            if (ipv6) {
                httpInterfaceNetwork =
                    static_cast<int>((ipv4) ? gmlc::networking::InterfaceNetworks::ALL :
                                              gmlc::networking::InterfaceNetworks::IPV6);
            }

            bool external = helics::fileops::getOrDefault(httpConfig, "external", false);
            helics::fileops::replaceIfMember(httpConfig, "all", external);
            if (external) {
                httpInterfaceNetwork = static_cast<int>(gmlc::networking::InterfaceNetworks::ALL);
            }
        }
        mHttpAddress = gmlc::networking::generateMatchingInterfaceAddress(
            mHttpAddress, static_cast<gmlc::networking::InterfaceNetworks>(httpInterfaceNetwork));
        gmlc::networking::removeProtocol(mHttpAddress);
        if (mHttpAddress == "*") {
            mHttpAddress = "0.0.0.0";
        }
        auto const address = net::ip::make_address(mHttpAddress);
        // Create and launch a listening port
        std::make_shared<Listener>(context->ioc,
                                   tcp::endpoint{address, static_cast<std::uint16_t>(mHttpPort)})
            ->run();
    }

    if (mWebsocketEnabled) {
        auto websocketInterfaceNetwork = mInterfaceNetwork;
        if (config->contains("websocket")) {
            const auto& webConfig = (*config)["websocket"];
            helics::fileops::replaceIfMember(webConfig, "interface", mWebsocketAddress);
            helics::fileops::replaceIfMember(webConfig, "port", mWebsocketPort);

            const bool ipv4 = helics::fileops::getOrDefault(webConfig, "ipv4", false);

            if (ipv4) {
                websocketInterfaceNetwork =
                    static_cast<int>(gmlc::networking::InterfaceNetworks::IPV4);
            }
            const bool ipv6 = helics::fileops::getOrDefault(webConfig, "ipv6", false);
            if (ipv6) {
                websocketInterfaceNetwork =
                    static_cast<int>((ipv4) ? gmlc::networking::InterfaceNetworks::ALL :
                                              gmlc::networking::InterfaceNetworks::IPV6);
            }

            bool external = helics::fileops::getOrDefault(webConfig, "external", false);
            helics::fileops::replaceIfMember(webConfig, "all", external);
            if (external) {
                websocketInterfaceNetwork =
                    static_cast<int>(gmlc::networking::InterfaceNetworks::ALL);
            }
        }
        mWebsocketAddress = gmlc::networking::generateMatchingInterfaceAddress(
            mWebsocketAddress,
            static_cast<gmlc::networking::InterfaceNetworks>(websocketInterfaceNetwork));
        gmlc::networking::removeProtocol(mWebsocketAddress);
        if (mWebsocketAddress == "*") {
            mWebsocketAddress = "0.0.0.0";
        }
        auto const address = net::ip::make_address(mWebsocketAddress);
        // Create and launch a listening port
        std::make_shared<Listener>(context->ioc,
                                   tcp::endpoint{address,
                                                 static_cast<std::uint16_t>(mWebsocketPort)},
                                   true)
            ->run();
    }
    executing.store(true);
    // Run the I/O service
    if (running.load()) {
        context->ioc.run();
    }
    executing.store(false);
    keepAlive.reset();
}